

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<float>::Print(TPZMatrix<float> *this,char *name,ostream *out,MatrixOutputFormat form)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  undefined8 uVar10;
  long lVar11;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float fVar12;
  ios cout_state;
  char local_161;
  long local_160;
  long local_158;
  long local_150;
  char *local_148;
  char *local_140;
  ios local_138 [264];
  
  std::ios::ios(local_138,(streambuf *)0x0);
  std::ios::copyfmt((ios *)local_138);
  lVar11 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar11 + -0x18) + 8) = 9;
  if (EFixedColumn < form) goto LAB_00c71bc9;
  lVar7 = (this->super_TPZBaseMatrix).fRow;
  local_160 = (this->super_TPZBaseMatrix).fCol;
  iVar2 = (int)out;
  cVar1 = (char)out;
  local_158 = lVar7;
  switch(form) {
  case EFormatted:
    std::__ostream_insert<char,std::char_traits<char>>(out,"Writing matrix \'",0x10);
    lVar11 = local_158;
    if (name != (char *)0x0) {
      sVar4 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\' (",3);
    poVar5 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," x ",3);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):\n",3);
    if (0 < lVar11) {
      lVar11 = 0;
      local_148 = "\n";
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
        if (0 < local_160) {
          lVar7 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,lVar11,lVar7);
            poVar5 = std::ostream::_M_insert<double>((double)extraout_XMM0_Da);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
            lVar7 = lVar7 + 1;
          } while (local_160 != lVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_158);
      goto LAB_00c71bb7;
    }
    lVar11 = 1;
    local_148 = "\n";
    goto LAB_00c71bbc;
  case EInputFormat:
    poVar5 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    lVar11 = 9;
    local_148 = "-1 -1 0.\n";
    if (0 < lVar7) {
      lVar11 = 0;
      do {
        if (0 < local_160) {
          lVar7 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,lVar11,lVar7);
            local_150 = CONCAT44(local_150._4_4_,extraout_XMM0_Da_00);
            if ((extraout_XMM0_Da_00 != 0.0) || (NAN(extraout_XMM0_Da_00))) {
              poVar5 = std::ostream::_M_insert<long>((long)out);
              local_161 = ' ';
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_161,1);
              poVar5 = std::ostream::_M_insert<long>((long)poVar5);
              local_161 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_161,1);
              poVar5 = std::ostream::_M_insert<double>((double)(float)local_150);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
            }
            lVar7 = lVar7 + 1;
          } while (local_160 != lVar7);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_158);
      lVar11 = 9;
    }
    goto LAB_00c71bbc;
  case EMathematicaInput:
    if (name == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(lVar11 + -0x18));
    }
    else {
      sVar4 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
    }
    lVar11 = local_158;
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
    if (0 < lVar11) {
      local_150 = local_160 + -1;
      local_148 = (char *)(lVar11 + -1);
      lVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
        if (0 < local_160) {
          uVar8 = 1;
          lVar7 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,lVar11,lVar7);
            std::ostream::_M_insert<double>((double)extraout_XMM0_Da_03);
            if (lVar7 < local_150) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            }
            if ((uVar8 / 6) * 6 + -1 == lVar7) {
              local_161 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(out,&local_161,1);
            }
            lVar7 = lVar7 + 1;
            uVar8 = uVar8 + 1;
          } while (local_160 != lVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
        if (lVar11 < (long)local_148) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_158);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," };",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    break;
  case EMatlabNonZeros:
    if (name == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(lVar11 + -0x18));
    }
    else {
      sVar4 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
    }
    local_148 = "\n";
    if (0 < local_158) {
      lVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n|",2);
        if (0 < local_160) {
          lVar7 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,lVar11,lVar7);
            pcVar9 = ".";
            if (1e-06 <= ABS(extraout_XMM0_Da_04)) {
              pcVar9 = "#";
            }
            std::__ostream_insert<char,std::char_traits<char>>(out,pcVar9,1);
            lVar7 = lVar7 + 1;
          } while (local_160 != lVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"|",1);
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_158);
    }
LAB_00c71bb7:
    lVar11 = 1;
LAB_00c71bbc:
    std::__ostream_insert<char,std::char_traits<char>>(out,local_148,lVar11);
    break;
  case EMatrixMarket:
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
    local_148 = (char *)CONCAT44(local_148._4_4_,iVar3);
    local_140 = name;
    if (0 < local_158) {
      lVar11 = 0;
      do {
        local_150 = lVar11 + 1;
        lVar7 = local_150;
        if ((int)local_148 == 0) {
          lVar7 = local_158;
        }
        if (lVar7 < 2) {
          lVar7 = 1;
        }
        lVar6 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar11,lVar6);
          lVar6 = lVar6 + 1;
        } while (lVar7 != lVar6);
        lVar11 = local_150;
      } while (local_150 != local_158);
    }
    lVar11 = local_158;
    std::__ostream_insert<char,std::char_traits<char>>(out,"%%",2);
    pcVar9 = local_140;
    if (local_140 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)out + -0x18));
    }
    else {
      sVar4 = strlen(local_140);
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar9,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    poVar5 = std::ostream::_M_insert<long>((long)out);
    local_161 = ' ';
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_161,1);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    local_161 = ' ';
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_161,1);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (0 < lVar11) {
      lVar7 = 0;
      do {
        local_150 = lVar7 + 1;
        lVar6 = local_150;
        if ((int)local_148 == 0) {
          lVar6 = lVar11;
        }
        if (lVar6 < 2) {
          lVar6 = 1;
        }
        lVar11 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar11);
          local_160 = CONCAT44(local_160._4_4_,extraout_XMM0_Da_05);
          if ((extraout_XMM0_Da_05 != 0.0) || (NAN(extraout_XMM0_Da_05))) {
            poVar5 = std::ostream::_M_insert<long>((long)out);
            local_161 = ' ';
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_161,1);
            poVar5 = std::ostream::_M_insert<long>((long)poVar5);
            local_161 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_161,1);
            poVar5 = std::ostream::_M_insert<double>((double)(float)local_160);
            local_161 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_161,1);
          }
          lVar11 = lVar11 + 1;
        } while (lVar6 != lVar11);
        lVar11 = local_158;
        lVar7 = local_150;
      } while (local_150 != local_158);
    }
    break;
  case ECSV:
    if (0 < lVar7) {
      lVar11 = local_160 + -1;
      local_150 = lVar7 + -1;
      lVar7 = 0;
      do {
        if (0 < local_160) {
          lVar6 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar6)
            ;
            std::ostream::_M_insert<double>((double)extraout_XMM0_Da_01);
            if (lVar6 < lVar11) {
              std::__ostream_insert<char,std::char_traits<char>>(out," , ",3);
            }
            lVar6 = lVar6 + 1;
          } while (local_160 != lVar6);
        }
        if (lVar7 < local_150) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != local_158);
    }
    break;
  case EFixedColumn:
    std::__ostream_insert<char,std::char_traits<char>>(out,"Writing matrix \'",0x10);
    lVar11 = local_158;
    if (name != (char *)0x0) {
      sVar4 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\' (",3);
    poVar5 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," x ",3);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):\n",3);
    if (0 < lVar11) {
      lVar11 = 0;
      do {
        if (0 < local_160) {
          lVar7 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      (this,lVar11,lVar7);
            uVar10 = 10;
            fVar12 = extraout_XMM0_Da_02;
            if (0.0 <= extraout_XMM0_Da_02) {
              uVar10 = 9;
              local_150 = CONCAT44(local_150._4_4_,extraout_XMM0_Da_02);
              std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
              fVar12 = (float)local_150;
            }
            lVar6 = *(long *)out;
            *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = uVar10;
            lVar6 = *(long *)(lVar6 + -0x18);
            *(uint *)(out + lVar6 + 0x18) = *(uint *)(out + lVar6 + 0x18) & 0xffffff4f | 0x20;
            poVar5 = std::ostream::_M_insert<double>((double)fVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            lVar7 = lVar7 + 1;
          } while (local_160 != lVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_158);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  }
LAB_00c71bc9:
  std::ios::copyfmt((ios *)(out + *(long *)(*(long *)out + -0x18)));
  std::ios_base::~ios_base((ios_base *)local_138);
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}